

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O2

int nn_timerset_timeout(nn_timerset *self)

{
  int iVar1;
  int iVar2;
  nn_list_item *pnVar3;
  uint64_t uVar4;
  
  iVar1 = nn_list_empty(&self->timeouts);
  if (iVar1 != 0) {
    return -1;
  }
  nn_list_begin(&self->timeouts);
  pnVar3 = nn_list_begin(&self->timeouts);
  iVar1 = *(int *)&pnVar3[1].next;
  uVar4 = nn_clock_ms();
  iVar1 = iVar1 - (int)uVar4;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int nn_timerset_timeout (struct nn_timerset *self)
{
    int timeout;

    if (nn_fast (nn_list_empty (&self->timeouts)))
        return -1;

    timeout = (int) (nn_cont (nn_list_begin (&self->timeouts),
        struct nn_timerset_hndl, list)->timeout - nn_clock_ms());
    return timeout < 0 ? 0 : timeout;
}